

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMarkers::UpdateRelMarkerCoords(ChLinkMarkers *this)

{
  ChVector<double> *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ChMarker *pCVar4;
  ChMarker *pCVar5;
  undefined1 auVar6 [16];
  ChQuaternion<double> *quat;
  bool bVar7;
  ChQuaternion<double> *pCVar8;
  undefined1 *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  ChGwMatrix34<double> relGw;
  ChMatrix33<double> m2_Rel_A_dt;
  ChMatrix33<double> m2_Rel_A_dtdt;
  ChQuaternion<double> local_360;
  ChQuaternion<double> local_338;
  ChQuaternion<double> *local_318;
  ChVector<double> *local_310;
  ChQuaternion<double> *local_308;
  ChGwMatrix34<double> local_300;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_288;
  ChQuaternion<double> local_280;
  ChQuaternion<double> local_260;
  ChQuaternion<double> local_240;
  ChMatrix33<double> local_208;
  ChQuaternion<double> local_1c0;
  double local_198;
  ChQuaternion<double> *local_190;
  ChVector<double> *local_188;
  ChQuaternion<double> *local_180;
  ChQuaternion<double> local_178;
  ChMatrix33<double> local_158;
  ChQuaternion<double> local_110;
  double local_f0;
  double dStack_e8;
  ChQuaternion<double> local_e0;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_c0;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_b8;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_b0;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_a8;
  ChQuaternion<double> local_a0;
  ChQuaternion<double> local_80 [2];
  
  pCVar4 = this->marker1;
  pCVar5 = this->marker2;
  pCVar1 = &this->PQw;
  auVar14._0_8_ = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  auVar12._0_8_ = (pCVar5->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  auVar6 = vsubpd_avx(*(undefined1 (*) [16])
                       (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data,
                      *(undefined1 (*) [16])
                       (pCVar5->abs_frame).super_ChFrame<double>.coord.pos.m_data);
  *(undefined1 (*) [16])(this->PQw).m_data = auVar6;
  (this->PQw).m_data[2] = auVar14._0_8_ - auVar12._0_8_;
  auVar14._0_8_ = (pCVar4->abs_frame).coord_dt.pos.m_data[2];
  auVar12._0_8_ = (pCVar5->abs_frame).coord_dt.pos.m_data[2];
  auVar6 = vsubpd_avx(*(undefined1 (*) [16])(pCVar4->abs_frame).coord_dt.pos.m_data,
                      *(undefined1 (*) [16])(pCVar5->abs_frame).coord_dt.pos.m_data);
  *(undefined1 (*) [16])(this->PQw_dt).m_data = auVar6;
  (this->PQw_dt).m_data[2] = auVar14._0_8_ - auVar12._0_8_;
  auVar14._0_8_ = (pCVar4->abs_frame).coord_dtdt.pos.m_data[2];
  auVar12._0_8_ = (pCVar5->abs_frame).coord_dtdt.pos.m_data[2];
  auVar6 = vsubpd_avx(*(undefined1 (*) [16])(pCVar4->abs_frame).coord_dtdt.pos.m_data,
                      *(undefined1 (*) [16])(pCVar5->abs_frame).coord_dtdt.pos.m_data);
  *(undefined1 (*) [16])(this->PQw_dtdt).m_data = auVar6;
  (this->PQw_dtdt).m_data[2] = auVar14._0_8_ - auVar12._0_8_;
  auVar14._0_8_ = ChVector<double>::Length(pCVar1);
  this->dist = auVar14._0_8_;
  local_310 = pCVar1;
  Vnorm<double>((ChVector<double> *)&local_300,pCVar1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->PQw_dt).m_data[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] *
       (this->PQw_dt).m_data[1];
  auVar6 = vfmadd231sd_fma(auVar13,auVar10,auVar6);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->PQw_dt).m_data[2];
  auVar6 = vfmadd132sd_fma(auVar11,auVar6,auVar3);
  this->dist_dt = auVar6._0_8_;
  local_240.m_data[0] = 0.0;
  local_240.m_data[1] = 0.0;
  local_240.m_data[2] = 0.0;
  local_240.m_data[3] = 0.0;
  pCVar4 = this->marker1;
  local_260.m_data[0] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_260.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_260.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_260.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  pCVar4 = this->marker2;
  local_280.m_data[0] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
  local_280.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
  local_280.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
  local_280.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  bVar7 = Qnotnull(&local_260);
  if (!bVar7) {
    bVar7 = Qnotnull(&local_280);
    if (!bVar7) {
      puVar9 = QNULL;
      goto LAB_00ac0348;
    }
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_338,&local_1c0);
  Qcross((ChQuaternion<double> *)&local_158,&local_360);
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
  Qcross(&local_a0,&local_110);
  Qcross(local_80,&local_e0);
  puVar9 = (undefined1 *)&local_300;
  Qadd((ChQuaternion<double> *)&local_208,&local_178);
LAB_00ac0348:
  ChQuaternion<double>::operator=(&this->q_AD,(ChQuaternion<double> *)puVar9);
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_338,&local_1c0);
  Qcross((ChQuaternion<double> *)&local_158,&local_360);
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_a0,&local_110);
  Qcross(local_80,&local_e0);
  Qadd((ChQuaternion<double> *)&local_208,&local_178);
  local_180 = &this->q_BC;
  ChQuaternion<double>::operator=(local_180,(ChQuaternion<double> *)&local_300);
  pCVar4 = this->marker2;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot;
  if (pCVar8 != &local_280) {
    local_280.m_data[0] = pCVar8->m_data[0];
    local_280.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
    local_280.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
    local_280.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  }
  bVar7 = Qnotnull(&local_280);
  if (bVar7) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dtdt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_360,&local_338);
    puVar9 = (undefined1 *)&local_300;
    Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
  }
  else {
    puVar9 = QNULL;
  }
  ChQuaternion<double>::operator=(&this->q_8,(ChQuaternion<double> *)puVar9);
  pCVar4 = this->marker1;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot;
  if (pCVar8 != &local_260) {
    local_260.m_data[0] = pCVar8->m_data[0];
    local_260.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[1];
    local_260.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[2];
    local_260.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dtdt.rot.m_data[3];
  }
  bVar7 = Qnotnull(&local_260);
  if (bVar7) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dtdt.rot);
    Qcross(&local_360,&local_338);
    Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qadd(&this->q_8,&local_240);
    ChQuaternion<double>::operator=(&this->q_8,(ChQuaternion<double> *)&local_300);
  }
  pCVar4 = this->marker2;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar8 != &local_280) {
    local_280.m_data[0] = pCVar8->m_data[0];
    local_280.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_280.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_280.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar7 = Qnotnull(&local_280);
  if (bVar7) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_360,&local_338);
    Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_300,&local_240,2.0);
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qadd(&this->q_8,&local_240);
    ChQuaternion<double>::operator=(&this->q_8,(ChQuaternion<double> *)&local_300);
  }
  pCVar4 = this->marker2;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar8 != &local_280) {
    local_280.m_data[0] = pCVar8->m_data[0];
    local_280.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_280.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_280.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar7 = Qnotnull(&local_280);
  if (bVar7) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
           &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qcross(&local_360,&local_338);
    Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_300,&local_240,2.0);
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qadd(&this->q_8,&local_240);
    ChQuaternion<double>::operator=(&this->q_8,(ChQuaternion<double> *)&local_300);
  }
  pCVar4 = this->marker1;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar8 != &local_260) {
    local_260.m_data[0] = pCVar8->m_data[0];
    local_260.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_260.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_260.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  pCVar4 = this->marker2;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar8 != &local_280) {
    local_280.m_data[0] = pCVar8->m_data[0];
    local_280.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_280.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_280.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar7 = Qnotnull(&local_280);
  if (bVar7) {
    bVar7 = Qnotnull(&local_260);
    if (bVar7) {
      Qconjugate(&(this->marker2->super_ChFrameMoving<double>).coord_dt.rot);
      Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  coord.rot);
      Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
              coord.rot,&(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
      Qcross(&local_360,&local_338);
      Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
      local_240.m_data[0] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
      local_240.m_data[1] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
      local_240.m_data[2] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
      local_240.m_data[3] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
      Qscale((ChQuaternion<double> *)&local_300,&local_240,2.0);
      local_240.m_data[0] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
      local_240.m_data[1] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
      local_240.m_data[2] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
      local_240.m_data[3] =
           local_300.super_ChMatrix34<double>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
      Qadd(&this->q_8,&local_240);
      ChQuaternion<double>::operator=(&this->q_8,(ChQuaternion<double> *)&local_300);
    }
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_360,&local_338);
  Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
  local_240.m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  local_240.m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
  local_240.m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  local_240.m_data[3] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
  Qscale((ChQuaternion<double> *)&local_300,&local_240,2.0);
  pCVar8 = &this->q_8;
  local_240.m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  local_240.m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
  local_240.m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  local_240.m_data[3] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
  Qadd(pCVar8,&local_240);
  local_308 = pCVar8;
  ChQuaternion<double>::operator=(pCVar8,(ChQuaternion<double> *)&local_300);
  pCVar4 = this->marker1;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar8 != &local_260) {
    local_260.m_data[0] = pCVar8->m_data[0];
    local_260.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_260.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_260.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  bVar7 = Qnotnull(&local_260);
  if (bVar7) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
            rot,&(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_360,&local_338);
    Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_300,&local_240,2.0);
    pCVar8 = local_308;
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qadd(local_308,&local_240);
    ChQuaternion<double>::operator=(pCVar8,(ChQuaternion<double> *)&local_300);
  }
  pCVar4 = this->marker1;
  pCVar8 = &(pCVar4->super_ChFrameMoving<double>).coord_dt.rot;
  if (pCVar8 != &local_260) {
    local_260.m_data[0] = pCVar8->m_data[0];
    local_260.m_data[1] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    local_260.m_data[2] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    local_260.m_data[3] = (pCVar4->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
  }
  local_318 = (ChQuaternion<double> *)&this->PQw_dt;
  bVar7 = Qnotnull(&local_260);
  if (bVar7) {
    Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                coord.rot);
    Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dt.rot,
           &(this->marker1->super_ChFrameMoving<double>).coord_dt.rot);
    Qcross(&local_360,&local_338);
    Qcross((ChQuaternion<double> *)&local_208,(ChQuaternion<double> *)&local_158);
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qscale((ChQuaternion<double> *)&local_300,&local_240,2.0);
    pCVar8 = local_308;
    local_240.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    local_240.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    local_240.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
    local_240.m_data[3] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
    Qadd(local_308,&local_240);
    ChQuaternion<double>::operator=(pCVar8,(ChQuaternion<double> *)&local_300);
  }
  local_188 = &this->PQw_dtdt;
  ChFrameMoving<double>::Compute_Adt(&this->marker2->super_ChFrameMoving<double>,&local_208);
  ChFrameMoving<double>::Compute_Adtdt(&this->marker2->super_ChFrameMoving<double>,&local_158);
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,
             (ChMatrix33<double> *)&local_300);
  local_338.m_data[0] = (double)&local_300;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_338,local_310);
  local_80[0].m_data[0] = local_360.m_data[0];
  local_80[0].m_data[1] = local_360.m_data[1];
  local_80[0].m_data[2] = local_360.m_data[2];
  local_360.m_data[0] = (double)&local_208;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_360,
                    (ChVector<double> *)local_80);
  pCVar8 = local_318;
  (this->q_4).m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  (this->q_4).m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
  (this->q_4).m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  local_360.m_data[0] =
       (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_360,
                    (ChVector<double> *)local_318);
  local_360.m_data[0] = (double)&local_208;
  local_80[0].m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  local_80[0].m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
  local_80[0].m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_360,
                    (ChVector<double> *)local_80);
  auVar14._0_8_ = (this->q_4).m_data[2];
  auVar12._0_8_ = (this->q_4).m_data[1];
  (this->q_4).m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] +
       (this->q_4).m_data[0];
  (this->q_4).m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] +
       auVar12._0_8_;
  (this->q_4).m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] +
       auVar14._0_8_;
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,
             (ChMatrix33<double> *)&local_300);
  local_338.m_data[0] = (double)&local_300;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_338,
                    (ChVector<double> *)pCVar8);
  local_80[0].m_data[0] = local_360.m_data[0];
  local_80[0].m_data[1] = local_360.m_data[1];
  local_80[0].m_data[2] = local_360.m_data[2];
  local_360.m_data[0] =
       (double)&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_360,
                    (ChVector<double> *)local_80);
  pCVar1 = local_310;
  auVar14._0_8_ = (this->q_4).m_data[2];
  auVar12._0_8_ = (this->q_4).m_data[1];
  (this->q_4).m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] +
       (this->q_4).m_data[0];
  (this->q_4).m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] +
       auVar12._0_8_;
  (this->q_4).m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] +
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] +
       auVar14._0_8_;
  local_360.m_data[0] =
       (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_360,local_310);
  local_360.m_data[0] = (double)&local_158;
  local_80[0].m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  local_80[0].m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
  local_80[0].m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_360,
                    (ChVector<double> *)local_80);
  auVar14._0_8_ = (this->q_4).m_data[2];
  auVar12._0_8_ = (this->q_4).m_data[1];
  (this->q_4).m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0] +
       (this->q_4).m_data[0];
  (this->q_4).m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1] +
       auVar12._0_8_;
  (this->q_4).m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2] +
       auVar14._0_8_;
  local_338.m_data[0] =
       (double)&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_1c0.m_data[0] =
       (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_1c0,pCVar1);
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_338,
                    (ChVector<double> *)&local_360);
  if ((Coordsys *)&local_300 != &this->relM) {
    (this->relM).pos.m_data[0] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
    (this->relM).pos.m_data[1] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
    (this->relM).pos.m_data[2] =
         local_300.super_ChMatrix34<double>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  }
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(this->marker2->Body->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord.rot);
  Qcross(&(this->marker1->Body->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
          .coord.rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_1c0,&local_178);
  Qcross(&local_360,&local_338);
  local_190 = &(this->relM).rot;
  ChQuaternion<double>::operator=(local_190,(ChQuaternion<double> *)&local_300);
  pCVar1 = local_310;
  local_110.m_data[0] = (double)&local_208;
  local_288.m_matrix =
       &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_288,local_310);
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_110,
                    (ChVector<double> *)&local_338);
  local_a8.m_matrix =
       &(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,
             (ChMatrix33<double> *)&local_300);
  local_b0.m_matrix = (non_const_type)&local_300;
  chrono::operator*(&local_b0,pCVar1);
  chrono::operator*(&local_a8,(ChVector<double> *)&local_178);
  local_198 = local_360.m_data[2] + local_1c0.m_data[2];
  local_b8.m_matrix =
       &(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  local_f0 = local_360.m_data[0] + local_1c0.m_data[0];
  dStack_e8 = local_360.m_data[1] + local_1c0.m_data[1];
  local_c0.m_matrix =
       &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_c0,(ChVector<double> *)local_318);
  chrono::operator*(&local_b8,(ChVector<double> *)&local_a0);
  (this->relM_dt).pos.m_data[0] = local_f0 + local_e0.m_data[0];
  (this->relM_dt).pos.m_data[1] = dStack_e8 + local_e0.m_data[1];
  (this->relM_dt).pos.m_data[2] = local_198 + local_e0.m_data[2];
  Qadd(&this->q_AD,local_180);
  local_318 = &(this->relM_dt).rot;
  ChQuaternion<double>::operator=(local_318,(ChQuaternion<double> *)&local_300);
  local_e0.m_data[0] =
       (double)&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  ChFrameMoving<double>::Compute_Adtdt
            (&((this->super_ChLink).Body2)->super_ChFrameMoving<double>,
             (ChMatrix33<double> *)&local_300);
  local_a0.m_data[0] = (double)&local_300;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_a0,local_310);
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_e0,
                    (ChVector<double> *)&local_338);
  local_110.m_data[0] =
       (double)&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_288.m_matrix =
       &(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
        super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_288,local_188);
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_110,
                    (ChVector<double> *)&local_178);
  auVar14._0_8_ = (this->q_4).m_data[2];
  auVar12._0_8_ = (this->q_4).m_data[1];
  (this->relM_dtdt).pos.m_data[0] =
       local_360.m_data[0] + local_1c0.m_data[0] + (this->q_4).m_data[0];
  (this->relM_dtdt).pos.m_data[1] = local_360.m_data[1] + local_1c0.m_data[1] + auVar12._0_8_;
  (this->relM_dtdt).pos.m_data[2] = local_360.m_data[2] + local_1c0.m_data[2] + auVar14._0_8_;
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).coord_dtdt.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
          rot,&(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_1c0,&local_178);
  Qcross(&local_360,&local_338);
  local_240.m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  local_240.m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
  local_240.m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  local_240.m_data[3] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
  Qadd(local_308,&local_240);
  pCVar8 = &(this->relM_dtdt).rot;
  ChQuaternion<double>::operator=(pCVar8,(ChQuaternion<double> *)&local_300);
  Qconjugate(&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
              coord.rot);
  Qcross(&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).coord_dtdt.rot,
         &(this->marker1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross(&local_1c0,&local_178);
  Qcross(&local_360,&local_338);
  quat = local_190;
  local_240.m_data[0] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[0];
  local_240.m_data[1] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[1];
  local_240.m_data[2] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[2];
  local_240.m_data[3] =
       local_300.super_ChMatrix34<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>.m_storage.m_data.array[3];
  Qadd(pCVar8,&local_240);
  ChQuaternion<double>::operator=(pCVar8,(ChQuaternion<double> *)&local_300);
  Q_to_AngAxis(quat,&this->relAngle,&this->relAxis);
  auVar14._0_8_ = (this->relAxis).m_data[2];
  auVar12._0_8_ = this->relAngle;
  if (0.0 <= auVar14._0_8_) {
    dVar15 = (this->relAxis).m_data[0];
    dVar16 = (this->relAxis).m_data[1];
  }
  else {
    dVar15 = -(this->relAxis).m_data[0];
    dVar16 = -(this->relAxis).m_data[1];
    auVar14._0_8_ = -auVar14._0_8_;
    auVar14._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = -auVar12._0_8_;
    auVar12._8_8_ = 0x8000000000000000;
    (this->relAxis).m_data[0] = dVar15;
    (this->relAxis).m_data[1] = dVar16;
    dVar2 = (double)vmovlpd_avx(auVar14);
    (this->relAxis).m_data[2] = dVar2;
    dVar2 = (double)vmovlpd_avx(auVar12);
    this->relAngle = dVar2;
  }
  (this->relRotaxis).m_data[0] = auVar12._0_8_ * dVar15;
  (this->relRotaxis).m_data[1] = auVar12._0_8_ * dVar16;
  (this->relRotaxis).m_data[2] = auVar12._0_8_ * auVar14._0_8_;
  ChGwMatrix34<double>::ChGwMatrix34(&local_300,quat);
  chrono::operator*(&local_300.super_ChMatrix34<double>,local_318);
  if (&local_360 != (ChQuaternion<double> *)&this->relWvel) {
    (this->relWvel).m_data[0] = local_360.m_data[0];
    (this->relWvel).m_data[1] = local_360.m_data[1];
    (this->relWvel).m_data[2] = local_360.m_data[2];
  }
  chrono::operator*(&local_300.super_ChMatrix34<double>,pCVar8);
  if (&local_360 != (ChQuaternion<double> *)&this->relWacc) {
    (this->relWacc).m_data[0] = local_360.m_data[0];
    (this->relWacc).m_data[1] = local_360.m_data[1];
    (this->relWacc).m_data[2] = local_360.m_data[2];
  }
  return;
}

Assistant:

void ChLinkMarkers::UpdateRelMarkerCoords() {
    PQw = Vsub(marker1->GetAbsCoord().pos, marker2->GetAbsCoord().pos);
    PQw_dt = Vsub(marker1->GetAbsCoord_dt().pos, marker2->GetAbsCoord_dt().pos);
    PQw_dtdt = Vsub(marker1->GetAbsCoord_dtdt().pos, marker2->GetAbsCoord_dtdt().pos);

    dist = Vlength(PQw);                 // distance between origins, modulus
    dist_dt = Vdot(Vnorm(PQw), PQw_dt);  // speed between origins, modulus.

    Quaternion qtemp1;

    Quaternion temp1 = marker1->GetCoord_dt().rot;
    Quaternion temp2 = marker2->GetCoord_dt().rot;

    if (Qnotnull(temp1) || Qnotnull(temp2)) {
        q_AD =  //  q'qqq + qqqq'
            Qadd(Qcross(Qconjugate(marker2->GetCoord_dt().rot),
                        Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                               Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot)))),
                 Qcross(Qconjugate(marker2->GetCoord().rot),
                        Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                               Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord_dt().rot)))));
    } else
        q_AD = QNULL;

    q_BC =  // qq'qq + qqq'q
        Qadd(Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(marker2->GetBody()->GetCoord_dt().rot),
                           Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot)))),
             Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                           Qcross((marker1->GetBody()->GetCoord_dt().rot), (marker1->GetCoord().rot)))));

    // q_8 = q''qqq + 2q'q'qq + 2q'qq'q + 2q'qqq'
    //     + 2qq'q'q + 2qq'qq' + 2qqq'q' + qqqq''
    temp2 = marker2->GetCoord_dtdt().rot;
    if (Qnotnull(temp2))
        q_8 = Qcross(Qconjugate(marker2->GetCoord_dtdt().rot),
                     Qcross(Qconjugate(Body2->GetCoord().rot),
                            Qcross(Body1->GetCoord().rot,
                                   marker1->GetCoord().rot)));  // q_dtdt'm2 * q'o2 * q,o1 * q,m1
    else
        q_8 = QNULL;
    temp1 = marker1->GetCoord_dtdt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                        Qcross(Qconjugate(Body2->GetCoord().rot),
                               Qcross(Body1->GetCoord().rot,
                                      marker1->GetCoord_dtdt().rot)));  // q'm2 * q'o2 * q,o1 * q_dtdt,m1
        q_8 = Qadd(q_8, qtemp1);
    }
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q_dt'o2 * q,o1 * q,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q'o2 * q_dt,o1 * q,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp1 = marker1->GetCoord_dt().rot;
    temp2 = marker2->GetCoord_dt().rot;
    if (Qnotnull(temp2) && Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord_dt().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q_dt'm2 * q'o2 * q,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }

    qtemp1 =
        Qcross(Qconjugate(marker2->GetCoord().rot),
               Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord().rot)));
    qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q_dt'o2 * q_dt,o1 * q,m1)
    q_8 = Qadd(q_8, qtemp1);
    temp1 = marker1->GetCoord_dt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord().rot),
            Qcross(Qconjugate(Body2->GetCoord_dt().rot), Qcross(Body1->GetCoord().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q_dt'o2 * q,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }
    temp1 = marker1->GetCoord_dt().rot;
    if (Qnotnull(temp1)) {
        qtemp1 = Qcross(
            Qconjugate(marker2->GetCoord().rot),
            Qcross(Qconjugate(Body2->GetCoord().rot), Qcross(Body1->GetCoord_dt().rot, marker1->GetCoord_dt().rot)));
        qtemp1 = Qscale(qtemp1, 2);  // 2( q'm2 * q'o2 * q_dt,o1 * q_dt,m1)
        q_8 = Qadd(q_8, qtemp1);
    }

    // q_4 = [Adtdt]'[A]'q + 2[Adt]'[Adt]'q
    //       + 2[Adt]'[A]'qdt + 2[A]'[Adt]'qdt
    ChMatrix33<> m2_Rel_A_dt;
    marker2->Compute_Adt(m2_Rel_A_dt);
    ChMatrix33<> m2_Rel_A_dtdt;
    marker2->Compute_Adtdt(m2_Rel_A_dtdt);

    ChVector<> vtemp1;
    ChVector<> vtemp2;

    vtemp1 = Body2->GetA_dt().transpose() * PQw;
    vtemp2 = m2_Rel_A_dt.transpose() * vtemp1;
    q_4 = Vmul(vtemp2, 2);  // 2[Aq_dt]'[Ao2_dt]'*Qpq,w

    vtemp1 = Body2->GetA().transpose() * PQw_dt;
    vtemp2 = m2_Rel_A_dt.transpose() * vtemp1;
    vtemp2 = Vmul(vtemp2, 2);  // 2[Aq_dt]'[Ao2]'*Qpq,w_dt
    q_4 = Vadd(q_4, vtemp2);

    vtemp1 = Body2->GetA_dt().transpose() * PQw_dt;
    vtemp2 = marker2->GetA().transpose() * vtemp1;
    vtemp2 = Vmul(vtemp2, 2);  // 2[Aq]'[Ao2_dt]'*Qpq,w_dt
    q_4 = Vadd(q_4, vtemp2);

    vtemp1 = Body2->GetA().transpose() * PQw;
    vtemp2 = m2_Rel_A_dtdt.transpose() * vtemp1;
    q_4 = Vadd(q_4, vtemp2);  //  [Aq_dtdt]'[Ao2]'*Qpq,w

    // ----------- RELATIVE MARKER COORDINATES

    // relM.pos
    relM.pos = marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw);

    // relM.rot
    relM.rot = Qcross(Qconjugate(marker2->GetCoord().rot),
                      Qcross(Qconjugate(marker2->GetBody()->GetCoord().rot),
                             Qcross((marker1->GetBody()->GetCoord().rot), (marker1->GetCoord().rot))));

    // relM_dt.pos
    relM_dt.pos = m2_Rel_A_dt.transpose() * (Body2->GetA().transpose() * PQw) +
                  marker2->GetA().transpose() * (Body2->GetA_dt().transpose() * PQw) +
                  marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw_dt);

    // relM_dt.rot
    relM_dt.rot = Qadd(q_AD, q_BC);

    // relM_dtdt.pos
    relM_dtdt.pos = marker2->GetA().transpose() * (Body2->GetA_dtdt().transpose() * PQw) +
                    marker2->GetA().transpose() * (Body2->GetA().transpose() * PQw_dtdt) + q_4;

    // relM_dtdt.rot
    qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(Body2->GetCoord_dtdt().rot),
                           Qcross(Body1->GetCoord().rot,
                                  marker1->GetCoord().rot)));  // ( q'm2 * q_dtdt'o2 * q,o1 * q,m1)
    relM_dtdt.rot = Qadd(q_8, qtemp1);
    qtemp1 = Qcross(Qconjugate(marker2->GetCoord().rot),
                    Qcross(Qconjugate(Body2->GetCoord().rot),
                           Qcross(Body1->GetCoord_dtdt().rot,
                                  marker1->GetCoord().rot)));  // ( q'm2 * q'o2 * q_dtdt,o1 * q,m1)
    relM_dtdt.rot = Qadd(relM_dtdt.rot, qtemp1);               // = q_8 + qq''qq + qqq''q

    // ... and also "user-friendly" relative coordinates:

    // relAngle and relAxis
    Q_to_AngAxis(relM.rot, relAngle, relAxis);
    // flip rel rotation axis if jerky sign
    if (relAxis.z() < 0) {
        relAxis = Vmul(relAxis, -1);
        relAngle = -relAngle;
    }
    // rotation axis
    relRotaxis = Vmul(relAxis, relAngle);
    // relWvel
    ChGwMatrix34<> relGw(relM.rot);
    relWvel = relGw * relM_dt.rot;
    // relWacc
    relWacc = relGw * relM_dtdt.rot;
}